

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DoAutoincrmerge(Fts3Table *p,char *zParam)

{
  int iVar1;
  sqlite3_stmt *local_30;
  sqlite3_stmt *pStmt;
  char *pcStack_20;
  int rc;
  char *zParam_local;
  Fts3Table *p_local;
  
  pStmt._4_4_ = 0;
  local_30 = (sqlite3_stmt *)0x0;
  pcStack_20 = zParam;
  zParam_local = (char *)p;
  iVar1 = fts3Getint(&stack0xffffffffffffffe0);
  *(int *)(zParam_local + 0x60) = iVar1;
  if ((*(int *)(zParam_local + 0x60) == 1) || (0x10 < *(int *)(zParam_local + 0x60))) {
    zParam_local[0x60] = '\b';
    zParam_local[0x61] = '\0';
    zParam_local[0x62] = '\0';
    zParam_local[99] = '\0';
  }
  if ((zParam_local[0x1c5] == '\0') &&
     (sqlite3Fts3CreateStatTable((int *)((long)&pStmt + 4),(Fts3Table *)zParam_local),
     pStmt._4_4_ != 0)) {
    p_local._4_4_ = pStmt._4_4_;
  }
  else {
    pStmt._4_4_ = fts3SqlStmt((Fts3Table *)zParam_local,0x17,&local_30,(sqlite3_value **)0x0);
    p_local._4_4_ = pStmt._4_4_;
    if (pStmt._4_4_ == 0) {
      sqlite3_bind_int(local_30,1,2);
      sqlite3_bind_int(local_30,2,*(int *)(zParam_local + 0x60));
      sqlite3_step(local_30);
      p_local._4_4_ = sqlite3_reset(local_30);
    }
  }
  return p_local._4_4_;
}

Assistant:

static int fts3DoAutoincrmerge(
  Fts3Table *p,                   /* FTS3 table handle */
  const char *zParam              /* Nul-terminated string containing boolean */
){
  int rc = SQLITE_OK;
  sqlite3_stmt *pStmt = 0;
  p->nAutoincrmerge = fts3Getint(&zParam);
  if( p->nAutoincrmerge==1 || p->nAutoincrmerge>FTS3_MERGE_COUNT ){
    p->nAutoincrmerge = 8;
  }
  if( !p->bHasStat ){
    assert( p->bFts4==0 );
    sqlite3Fts3CreateStatTable(&rc, p);
    if( rc ) return rc;
  }
  rc = fts3SqlStmt(p, SQL_REPLACE_STAT, &pStmt, 0);
  if( rc ) return rc;
  sqlite3_bind_int(pStmt, 1, FTS_STAT_AUTOINCRMERGE);
  sqlite3_bind_int(pStmt, 2, p->nAutoincrmerge);
  sqlite3_step(pStmt);
  rc = sqlite3_reset(pStmt);
  return rc;
}